

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattr_set.c
# Opt level: O1

int lattr_pset(uchar *val,mpt_convertable *src,int *def)

{
  bool bVar1;
  uint uVar2;
  uint8_t sym;
  int32_t tmp;
  byte local_1d;
  uint local_1c;
  
  if (src != (mpt_convertable *)0x0) {
    uVar2 = (*src->_vptr->convert)(src,0x79,&local_1d);
    if ((int)uVar2 < 0) {
      local_1c = (uint)*val;
      uVar2 = (*src->_vptr->convert)(src,0x69,&local_1c);
      if ((int)uVar2 < 0) {
        bVar1 = false;
        local_1c = uVar2;
      }
      else if (local_1c < 0x100) {
        local_1d = (byte)local_1c;
        bVar1 = true;
      }
      else {
        bVar1 = false;
        local_1c = 0xfffffffe;
      }
      if (!bVar1) {
        return local_1c;
      }
    }
    if (uVar2 != 0) {
      if ((int)(uint)local_1d < def[1]) {
        return -2;
      }
      if (def[2] < (int)(uint)local_1d) {
        return -2;
      }
      goto LAB_00106dda;
    }
  }
  local_1d = (byte)*def;
LAB_00106dda:
  *val = local_1d;
  return 0;
}

Assistant:

static int lattr_pset(unsigned char *val, MPT_INTERFACE(convertable) *src, int def[3])
{
	int len;
	uint8_t sym;
	
	if (!src) {
		*val = def[0];
		return 0;
	}
	if ((len = src->_vptr->convert(src, 'y', &sym)) < 0) {
		int32_t tmp = *val;
		if ((len = src->_vptr->convert(src, 'i', &tmp)) < 0) {
			return len;
		}
		if (tmp < 0 || tmp > UINT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		sym = tmp;
	}
	if (!len) {
		*val = def[0];
		return 0;
	}
	if (sym < def[1] || sym > def[2]) {
		return MPT_ERROR(BadValue);
	}
	*val = sym;
	
	return 0;
}